

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

MIR_reg_t add_ld_st(gen_ctx_t gen_ctx,MIR_op_t *mem_op,MIR_reg_t loc,MIR_reg_t base_reg,
                   MIR_op_mode_t data_mode,MIR_reg_t hard_reg,int st_p,MIR_reg_t temp_hard_reg,
                   MIR_insn_t anchor,int after_p)

{
  MIR_context_t ctx_00;
  FILE *__stream;
  bb_insn_t_conflict before;
  MIR_type_t type_00;
  int iVar1;
  uint uVar2;
  MIR_disp_t offset_00;
  MIR_insn_t_conflict pMVar3;
  bb_t_conflict pbVar4;
  bb_insn_t_conflict elem;
  char *pcVar5;
  MIR_insn_code_t local_278;
  MIR_insn_code_t local_274;
  ulong local_270;
  size_t i_2;
  size_t j;
  size_t i_1;
  size_t i;
  bb_t_conflict bb;
  MIR_op_t local_218;
  MIR_op_t local_1e8;
  MIR_op_t local_1b8;
  MIR_op_t local_188;
  MIR_op_t local_158;
  MIR_op_t local_128;
  MIR_op_t local_f8;
  size_t local_c0;
  size_t n;
  MIR_op_t hard_reg_op;
  bb_insn_t_conflict new_bb_insn;
  bb_insn_t_conflict bb_insn;
  MIR_insn_t_conflict pMStack_68;
  MIR_type_t type;
  MIR_insn_t new_insns [3];
  MIR_insn_t new_insn;
  MIR_insn_code_t code;
  MIR_disp_t offset;
  MIR_context_t ctx;
  MIR_reg_t hard_reg_local;
  MIR_op_mode_t data_mode_local;
  MIR_reg_t base_reg_local;
  MIR_reg_t loc_local;
  MIR_op_t *mem_op_local;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  if (temp_hard_reg == 0xffffffff) {
    __assert_fail("temp_hard_reg != (4294967295U)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1e15,
                  "MIR_reg_t add_ld_st(gen_ctx_t, MIR_op_t *, MIR_reg_t, MIR_reg_t, MIR_op_mode_t, MIR_reg_t, int, MIR_reg_t, MIR_insn_t, int)"
                 );
  }
  type_00 = mode2type(data_mode);
  if (type_00 == MIR_T_I64) {
    local_274 = MIR_MOV;
  }
  else {
    if (type_00 == MIR_T_F) {
      local_278 = MIR_FMOV;
    }
    else {
      local_278 = MIR_LDMOV;
      if (type_00 == MIR_T_D) {
        local_278 = MIR_DMOV;
      }
    }
    local_274 = local_278;
  }
  if (hard_reg != 0xffffffff) {
    setup_used_hard_regs(gen_ctx,type_00,hard_reg);
  }
  offset_00 = target_get_stack_slot_offset(gen_ctx,type_00,loc - 0x22);
  local_c0 = 0;
  iVar1 = target_valid_mem_offset_p(gen_ctx,type_00,offset_00);
  if (iVar1 == 0) {
    _MIR_new_var_op(&local_128,ctx_00,temp_hard_reg);
    MIR_new_int_op(&local_158,ctx_00,offset_00);
    pMStack_68 = MIR_new_insn(ctx_00,MIR_MOV);
    _MIR_new_var_op(&local_188,ctx_00,temp_hard_reg);
    _MIR_new_var_op(&local_1b8,ctx_00,temp_hard_reg);
    _MIR_new_var_op(&local_1e8,ctx_00,base_reg);
    new_insns[0] = MIR_new_insn(ctx_00,MIR_ADD);
    local_c0 = 2;
    _MIR_new_var_mem_op(&local_218,ctx_00,type_00,0,temp_hard_reg,0xffffffff,'\0');
    memcpy(mem_op,&local_218,0x30);
  }
  else {
    _MIR_new_var_mem_op(&local_f8,ctx_00,type_00,offset_00,base_reg,0xffffffff,'\0');
    memcpy(mem_op,&local_f8,0x30);
  }
  if (hard_reg != 0xffffffff) {
    _MIR_new_var_op((MIR_op_t *)&bb,ctx_00,hard_reg);
    memcpy(&n,&bb,0x30);
    if (st_p == 0) {
      pMVar3 = MIR_new_insn(ctx_00,local_274);
      *(MIR_insn_t_conflict *)((long)&stack0xffffffffffffff98 + local_c0 * 8) = pMVar3;
    }
    else {
      pMVar3 = MIR_new_insn(ctx_00,local_274);
      *(MIR_insn_t_conflict *)((long)&stack0xffffffffffffff98 + local_c0 * 8) = pMVar3;
    }
    local_c0 = local_c0 + 1;
    if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      pbVar4 = get_insn_bb(gen_ctx,anchor);
      pcVar5 = "before";
      if (after_p != 0) {
        pcVar5 = "after";
      }
      fprintf((FILE *)gen_ctx->debug_file,"    Adding %s insn ",pcVar5);
      fprintf((FILE *)gen_ctx->debug_file," (in BB %lu",pbVar4->index);
      if ((gen_ctx->optimize_level == 0) || (pbVar4->loop_node == (loop_node_t_conflict)0x0)) {
        fprintf((FILE *)gen_ctx->debug_file,") ");
      }
      else {
        __stream = (FILE *)gen_ctx->debug_file;
        uVar2 = bb_loop_level(pbVar4);
        fprintf(__stream,", level %d) ",(ulong)uVar2);
      }
      MIR_output_insn(ctx_00,gen_ctx->debug_file,anchor,(gen_ctx->curr_func_item->u).func,0);
      fprintf((FILE *)gen_ctx->debug_file,":\n");
      for (i_1 = 0; i_1 < local_c0; i_1 = i_1 + 1) {
        fprintf((FILE *)gen_ctx->debug_file,"      ");
        MIR_output_insn(ctx_00,gen_ctx->debug_file,
                        *(MIR_insn_t_conflict *)((long)&stack0xffffffffffffff98 + i_1 * 8),
                        (gen_ctx->curr_func_item->u).func,1);
      }
    }
    if (after_p != 0) {
      i_2 = local_c0;
      for (j = 0; i_2 = i_2 - 1, j < i_2; j = j + 1) {
        new_insns[2] = *(MIR_insn_t *)((long)&stack0xffffffffffffff98 + j * 8);
        *(undefined8 *)((long)&stack0xffffffffffffff98 + j * 8) =
             *(undefined8 *)((long)&stack0xffffffffffffff98 + i_2 * 8);
        *(MIR_insn_t *)((long)&stack0xffffffffffffff98 + i_2 * 8) = new_insns[2];
      }
    }
    for (local_270 = 0; local_270 < local_c0; local_270 = local_270 + 1) {
      new_insns[2] = *(MIR_insn_t *)((long)&stack0xffffffffffffff98 + local_270 * 8);
      if (after_p == 0) {
        MIR_insert_insn_before(ctx_00,gen_ctx->curr_func_item,anchor,new_insns[2]);
      }
      else {
        MIR_insert_insn_after(ctx_00,gen_ctx->curr_func_item,anchor,new_insns[2]);
      }
      if (gen_ctx->optimize_level == 0) {
        pbVar4 = get_insn_data_bb(anchor);
        new_insns[2]->data = pbVar4;
      }
      else {
        before = (bb_insn_t_conflict)anchor->data;
        elem = create_bb_insn(gen_ctx,new_insns[2],before->bb);
        if (after_p == 0) {
          DLIST_bb_insn_t_insert_before(&before->bb->bb_insns,before,elem);
        }
        else {
          DLIST_bb_insn_t_insert_after(&before->bb->bb_insns,before,elem);
        }
      }
    }
  }
  return hard_reg;
}

Assistant:

static MIR_reg_t add_ld_st (gen_ctx_t gen_ctx, MIR_op_t *mem_op, MIR_reg_t loc, MIR_reg_t base_reg,
                            MIR_op_mode_t data_mode, MIR_reg_t hard_reg, int st_p,
                            MIR_reg_t temp_hard_reg, MIR_insn_t anchor, int after_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_disp_t offset;
  MIR_insn_code_t code;
  MIR_insn_t new_insn, new_insns[3];
  MIR_type_t type;
  bb_insn_t bb_insn, new_bb_insn;
  MIR_op_t hard_reg_op;
  size_t n;

  gen_assert (temp_hard_reg != MIR_NON_VAR);
  type = mode2type (data_mode);
  code = (type == MIR_T_I64 ? MIR_MOV
          : type == MIR_T_F ? MIR_FMOV
          : type == MIR_T_D ? MIR_DMOV
                            : MIR_LDMOV);
  if (hard_reg != MIR_NON_VAR) setup_used_hard_regs (gen_ctx, type, hard_reg);
  offset = target_get_stack_slot_offset (gen_ctx, type, loc - MAX_HARD_REG - 1);
  n = 0;
  if (target_valid_mem_offset_p (gen_ctx, type, offset)) {
    *mem_op = _MIR_new_var_mem_op (ctx, type, offset, base_reg, MIR_NON_VAR, 0);
  } else {
    new_insns[0] = MIR_new_insn (ctx, MIR_MOV, _MIR_new_var_op (ctx, temp_hard_reg),
                                 MIR_new_int_op (ctx, offset));
    new_insns[1]
      = MIR_new_insn (ctx, MIR_ADD, _MIR_new_var_op (ctx, temp_hard_reg),
                      _MIR_new_var_op (ctx, temp_hard_reg), _MIR_new_var_op (ctx, base_reg));
    n = 2;
    *mem_op = _MIR_new_var_mem_op (ctx, type, 0, temp_hard_reg, MIR_NON_VAR, 0);
  }
  if (hard_reg == MIR_NON_VAR) return hard_reg; /* LD vars can be always kept in memory */
  hard_reg_op = _MIR_new_var_op (ctx, hard_reg);
  if (!st_p) {
    new_insns[n++] = MIR_new_insn (ctx, code, hard_reg_op, *mem_op);
  } else {
    new_insns[n++] = MIR_new_insn (ctx, code, *mem_op, hard_reg_op);
  }
  DEBUG (2, {
    bb_t bb = get_insn_bb (gen_ctx, anchor);
    fprintf (debug_file, "    Adding %s insn ", after_p ? "after" : "before");
    fprintf (debug_file, " (in BB %lu", (unsigned long) bb->index);
    if (optimize_level == 0 || bb->loop_node == NULL)
      fprintf (debug_file, ") ");
    else
      fprintf (debug_file, ", level %d) ", bb_loop_level (bb));
    MIR_output_insn (ctx, debug_file, anchor, curr_func_item->u.func, FALSE);
    fprintf (debug_file, ":\n");
    for (size_t i = 0; i < n; i++) {
      fprintf (debug_file, "      ");
      MIR_output_insn (ctx, debug_file, new_insns[i], curr_func_item->u.func, TRUE);
    }
  });
  if (after_p) {
    for (size_t i = 0, j = n - 1; i < j; i++, j--) { /* reverse for subsequent correct insertion: */
      new_insn = new_insns[i];
      new_insns[i] = new_insns[j];
      new_insns[j] = new_insn;
    }
  }
  for (size_t i = 0; i < n; i++) {
    new_insn = new_insns[i];
    if (after_p)
      MIR_insert_insn_after (ctx, curr_func_item, anchor, new_insn);
    else
      MIR_insert_insn_before (ctx, curr_func_item, anchor, new_insn);
    if (optimize_level == 0) {
      new_insn->data = get_insn_data_bb (anchor);
    } else {
      bb_insn = anchor->data;
      new_bb_insn = create_bb_insn (gen_ctx, new_insn, bb_insn->bb);
      if (after_p)
        DLIST_INSERT_AFTER (bb_insn_t, bb_insn->bb->bb_insns, bb_insn, new_bb_insn);
      else
        DLIST_INSERT_BEFORE (bb_insn_t, bb_insn->bb->bb_insns, bb_insn, new_bb_insn);
    }
  }
  return hard_reg;
}